

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

int zlib_check(file *file,png_uint_32 offset)

{
  chunk *pcVar1;
  IDAT *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  zlib local_118;
  fpos_t start_pos;
  
  file_getpos(file,&start_pos);
  pcVar1 = file->chunk;
  pIVar2 = file->idat;
  clear(&local_118,0xd8);
  local_118.file = pcVar1->file;
  local_118.global = pcVar1->global;
  local_118.z.next_in = (Bytef *)0x0;
  local_118.z.avail_in = 0;
  local_118.z.opaque = (voidpf)0x0;
  local_118.z.zalloc = (alloc_func)0x0;
  local_118.z.zfree = (free_func)0x0;
  local_118.state = -1;
  local_118.window_bits = 0;
  local_118.compressed_digits = 0;
  local_118.uncompressed_digits = 0;
  local_118.file_bits = 0x18;
  local_118.ok_bits = 0x10;
  local_118.cksum = 0;
  iVar7 = 0;
  local_118.idat = pIVar2;
  local_118.chunk = pcVar1;
  local_118.rewrite_offset = offset;
  local_118.rc = inflateInit2_(&local_118.z,0,"1.2.11",0x70);
  iVar3 = 1;
  if (local_118.rc == 0) {
    local_118.state = 0;
    iVar3 = zlib_run(&local_118);
    if (iVar3 == 1) {
      if ((((undefined1  [96])((undefined1  [96])*local_118.global & (undefined1  [96])0x4) ==
            (undefined1  [96])0x0) && (local_118.window_bits == local_118.file_bits)) &&
         (local_118.cksum == 0)) {
LAB_001051a2:
        iVar7 = 1;
        goto LAB_00104fcb;
      }
      iVar3 = 0xf;
      iVar7 = 8;
      if ((local_118.uncompressed_digits < 2) && (local_118.uncompressed_bytes[0] < 0x4001)) {
        if (local_118.uncompressed_bytes[0] < 0x2001) {
          if (local_118.uncompressed_bytes[0] < 0x1001) {
            if (local_118.uncompressed_bytes[0] < 0x801) {
              if (local_118.uncompressed_bytes[0] < 0x401) {
                if (local_118.uncompressed_bytes[0] < 0x201) {
                  iVar3 = 9 - (uint)(local_118.uncompressed_bytes[0] < 0x101);
                }
                else {
                  iVar3 = 10;
                }
              }
              else {
                iVar3 = 0xb;
              }
            }
            else {
              iVar3 = 0xc;
            }
          }
          else {
            iVar3 = 0xd;
          }
        }
        else {
          iVar3 = 0xe;
        }
      }
      if (local_118.ok_bits < iVar3) {
        iVar3 = local_118.ok_bits;
      }
      if (local_118.cksum != 0) {
        chunk_message(local_118.chunk,"zlib checksum");
      }
    }
    else {
      if (iVar3 == 0) {
        local_118.z.msg = "[truncated]";
        iVar3 = 0;
        goto LAB_00104fc3;
      }
      if (iVar3 != -1) goto LAB_00104fcb;
      *(byte *)&file->status_code = (byte)file->status_code | 1;
      iVar7 = local_118.window_bits + 1;
      iVar3 = 0xf;
    }
    do {
      do {
        iVar5 = iVar3;
        if (local_118.ok_bits <= iVar5 && iVar5 <= iVar7) {
          if (local_118.ok_bits != iVar5) {
            __assert_fail("zlib.ok_bits == max_bits",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                          ,0xaac,"int zlib_check(struct file *, png_uint_32)");
          }
          goto LAB_001051a2;
        }
        if (local_118.state < 0) {
          __assert_fail("zlib->state >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                        ,0x872,"int zlib_reset(struct zlib *, int)");
        }
        local_118.z.next_in = (Bytef *)0x0;
        local_118.z.avail_in = 0;
        local_118.z.next_out = (Bytef *)0x0;
        iVar6 = iVar7 + iVar5 >> 1;
        local_118.z.avail_out = 0;
        local_118.compressed_digits = 0;
        local_118.uncompressed_digits = 0;
        local_118.state = 0;
        local_118.window_bits = iVar6;
        local_118.rc = inflateReset2(&local_118.z,0);
        if (local_118.rc != 0) {
          iVar3 = 1;
          goto LAB_00104fc3;
        }
        file_setpos(file,&start_pos);
        iVar4 = zlib_run(&local_118);
        iVar3 = iVar6;
      } while (iVar4 == 1);
      if (iVar4 != -1) {
        iVar7 = 0;
        goto LAB_00104fcb;
      }
      iVar7 = iVar6 + 1;
      iVar3 = iVar5;
    } while (iVar6 < iVar5);
    if (iVar6 != 0xf) {
      __assert_fail("test_bits == 15",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0xa8a,"int zlib_check(struct file *, png_uint_32)");
    }
    iVar3 = 0;
    if (local_118.z.msg == (char *)0x0) {
      local_118.z.msg = "invalid distance too far back";
    }
  }
LAB_00104fc3:
  iVar7 = 0;
  zlib_message(&local_118,iVar3);
LAB_00104fcb:
  zlib_end(&local_118);
  return iVar7;
}

Assistant:

static int /* global function; not a member function */
zlib_check(struct file *file, png_uint_32 offset)
   /* Check the stream of zlib compressed data in either idat (if given) or (if
    * not) chunk.  In fact it is zlib_run that handles the difference in reading
    * a single chunk and a list of IDAT chunks.
    *
    * In either case the input file must be positioned at the first byte of zlib
    * compressed data (the first header byte).
    *
    * The return value is true on success, including the case where the zlib
    * header may need to be rewritten, and false on an unrecoverable error.
    *
    * In the case of IDAT chunks 'offset' should be 0.
    */
{
   fpos_t start_pos;
   struct zlib zlib;

   /* Record the start of the LZ data to allow a re-read. */
   file_getpos(file, &start_pos);

   /* First test the existing (file) window bits: */
   if (zlib_init(&zlib, file->idat, file->chunk, 0/*window bits*/, offset))
   {
      int min_bits, max_bits, rc;

      /* The first run using the existing window bits. */
      rc = zlib_run(&zlib);

      switch (rc)
      {
         case ZLIB_TOO_FAR_BACK:
            /* too far back error */
            file->status_code |= TOO_FAR_BACK;
            min_bits = zlib.window_bits + 1;
            max_bits = 15;
            break;

         case ZLIB_STREAM_END:
            if (!zlib.global->optimize_zlib &&
               zlib.window_bits == zlib.file_bits && !zlib.cksum)
            {
               /* The trivial case where the stream is ok and optimization was
                * not requested.
                */
               zlib_end(&zlib);
               return 1;
            }

            max_bits = max_window_bits(zlib.uncompressed_bytes,
               zlib.uncompressed_digits);
            if (zlib.ok_bits < max_bits)
               max_bits = zlib.ok_bits;
            min_bits = 8;

            /* cksum is set if there is an error in the zlib header checksum
             * calculation in the original file (and this may be the only reason
             * a rewrite is required).  We can't rely on the file window bits in
             * this case, so do the optimization anyway.
             */
            if (zlib.cksum)
               chunk_message(zlib.chunk, "zlib checksum");
            break;


         case ZLIB_OK:
            /* Truncated stream; unrecoverable, gets converted to ZLIB_FATAL */
            zlib.z.msg = PNGZ_MSG_CAST("[truncated]");
            zlib_message(&zlib, 0/*expected*/);
            /* FALLTHROUGH */

         default:
            /* Unrecoverable error; skip the chunk; a zlib_message has already
             * been output.
             */
            zlib_end(&zlib);
            return 0;
      }

      /* Optimize window bits or fix a too-far-back error.  min_bits and
       * max_bits have been set appropriately, ok_bits records the bit value
       * known to work.
       */
      while (min_bits < max_bits || max_bits < zlib.ok_bits/*if 16*/)
      {
         int test_bits = (min_bits + max_bits) >> 1;

         if (zlib_reset(&zlib, test_bits))
         {
            file_setpos(file, &start_pos);
            rc = zlib_run(&zlib);

            switch (rc)
            {
               case ZLIB_TOO_FAR_BACK:
                  min_bits = test_bits+1;
                  if (min_bits > max_bits)
                  {
                     /* This happens when the stream really is damaged and it
                      * contains a distance code that addresses bytes before
                      * the start of the uncompressed data.
                      */
                     assert(test_bits == 15);

                     /* Output the error that wasn't output before: */
                     if (zlib.z.msg == NULL)
                        zlib.z.msg = PNGZ_MSG_CAST(
                           "invalid distance too far back");
                     zlib_message(&zlib, 0/*stream error*/);
                     zlib_end(&zlib);
                     return 0;
                  }
                  break;

               case ZLIB_STREAM_END: /* success */
                  max_bits = test_bits;
                  break;

               default:
                  /* A fatal error; this happens if a too-far-back error was
                   * hiding a more serious error, zlib_advance has already
                   * output a zlib_message.
                   */
                  zlib_end(&zlib);
                  return 0;
            }
         }

         else /* inflateReset2 failed */
         {
            zlib_end(&zlib);
            return 0;
         }
      }

      /* The loop guarantees this */
      assert(zlib.ok_bits == max_bits);
      zlib_end(&zlib);
      return 1;
   }

   else /* zlib initialization failed - skip the chunk */
   {
      zlib_end(&zlib);
      return 0;
   }
}